

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O3

NLW2_SOLReadResultCode __thiscall
mp::SOLReader2<mp::SOLHandler_Easy>::ReadSOLFile(SOLReader2<mp::SOLHandler_Easy> *this,string *name)

{
  char **__endptr;
  uiolen *__ptr;
  size_type sVar1;
  NLSolution *pNVar2;
  bool bVar3;
  NLW2_SOLReadResultCode NVar4;
  uint uVar5;
  int iVar6;
  FILE *__stream;
  size_t sVar7;
  uint *puVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  size_t sVar14;
  size_t sVar15;
  NLHeader *pNVar16;
  size_type sVar17;
  char *pcVar18;
  ulong __size;
  long lVar19;
  long lVar20;
  uiolen *__ptr_00;
  double dVar21;
  AMPLOptions ao;
  undefined1 local_78 [24];
  _Alloc_hider local_60;
  double local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  uiolen *local_38;
  
  pcVar18 = (name->_M_dataplus)._M_p;
  this->stub_ = pcVar18;
  __stream = fopen(pcVar18,"rb");
  this->internal_rv_ = 0x3e5;
  if (__stream == (FILE *)0x0) {
    serror(this,"can\'t open \'%s\'",this->stub_);
    this->internal_rv_ = 0x3e6;
    return NLW2_SOLRead_Fail_Open;
  }
  __ptr_00 = &this->L;
  sVar7 = fread(__ptr_00,4,1,__stream);
  if ((sVar7 != 0) && (this->L == 6)) {
    this->binary = 1;
    sVar7 = fread(this->buf,6,1,__stream);
    if ((sVar7 != 0) &&
       (((*(short *)(this->buf + 4) == 0x7972 && *(int *)this->buf == 0x616e6962 &&
         (sVar7 = fread(__ptr_00,4,1,__stream), sVar7 != 0)) && (*__ptr_00 == 6))))
    goto LAB_0010d657;
    goto LAB_0010d608;
  }
  this->binary = 0;
  rewind(__stream);
LAB_0010d657:
  this->need_vbtol = 0;
  this->have_options = 0;
  this->bs = 1;
  this->nbs = 0;
  if (this->binary == 0) {
    pcVar18 = this->buf;
    local_38 = __ptr_00;
    pcVar10 = fgets(pcVar18,0x200,__stream);
    if (pcVar10 != (char *)0x0) {
      __endptr = &this->se;
      pcVar10 = pcVar18;
LAB_0010d9f7:
      do {
        *__endptr = pcVar10;
        if (*pcVar10 != '\0') {
          if ((*pcVar10 != '\r') || (pcVar10[1] != '\n')) {
            pcVar10 = pcVar10 + 1;
            goto LAB_0010d9f7;
          }
          *pcVar10 = '\n';
          pcVar10 = *__endptr;
          *__endptr = pcVar10 + 1;
          pcVar10[1] = '\0';
        }
        if (*pcVar18 == '\n') goto LAB_0010db60;
        pcVar10 = this->se;
        sVar15 = (long)pcVar10 - (long)pcVar18;
        this->n1 = sVar15;
        this->b1 = pcVar18;
        pcVar9 = pcVar18;
        if ((*pcVar18 == '\b') && (this->bs != 0)) {
          this->n = sVar15;
          lVar20 = -0x189;
          pcVar9 = (char *)0x0;
          do {
            pcVar12 = pcVar9;
            this->n1 = (size_t)(pcVar10 + lVar20 + -(long)this);
            if (pcVar10 + -(long)this + -0x189 == pcVar12) {
              this->nbs = this->nbs + sVar15;
              goto LAB_0010daf9;
            }
            this->b1 = this->buf + (long)(pcVar12 + 1);
            lVar20 = lVar20 + -1;
            pcVar9 = pcVar12 + 1;
          } while (this->buf[(long)(pcVar12 + 1)] == '\b');
          this->nbs = (size_t)(pcVar12 + 1 + this->nbs);
          this->bs = 0;
          pcVar9 = this->buf + (long)(pcVar12 + 1);
        }
        std::__cxx11::string::append((char *)&this->solve_msg_,(ulong)pcVar9);
LAB_0010daf9:
        pcVar9 = fgets(pcVar18,0x200,__stream);
        pcVar10 = pcVar18;
      } while (pcVar9 != (char *)0x0);
    }
    pcVar18 = this->stub_;
    puVar8 = (uint *)__errno_location();
    serror(this,"error reading \'%s\' (errno=%d)",pcVar18,(ulong)*puVar8);
LAB_0010db37:
    this->readresult_ = NLW2_SOLRead_Early_EOF;
    NVar4 = NLW2_SOLRead_Early_EOF;
    goto LAB_0010db47;
  }
  pcVar18 = this->buf;
  do {
    sVar7 = fread(__ptr_00,4,1,__stream);
    if (sVar7 == 0) goto LAB_0010e527;
    uVar5 = this->L;
    this->L1 = uVar5;
LAB_0010d6c9:
    if (uVar5 != 0) {
      sVar7 = 0x200;
      if (uVar5 < 0x200) {
        sVar7 = (size_t)uVar5;
      }
      this->n = sVar7;
      this->L = uVar5 - (int)sVar7;
      sVar7 = fread(pcVar18,sVar7,1,__stream);
      if (sVar7 == 0) {
        pcVar18 = this->stub_;
        puVar8 = (uint *)__errno_location();
        serror(this,"error reading \'%s\' (errno=%d)",pcVar18,(ulong)*puVar8);
        goto LAB_0010db37;
      }
      uVar5 = this->L;
      sVar15 = this->n;
      sVar14 = sVar15;
      if (uVar5 == 0) {
        do {
          sVar15 = sVar14;
          sVar14 = sVar15 - 1;
          if (sVar14 == 0xffffffffffffffff) {
            sVar15 = 0;
            goto LAB_0010d74a;
          }
          this->n = sVar14;
        } while (this->buf[sVar15 - 1] == ' ');
        this->n = sVar15;
      }
LAB_0010d74a:
      this->b1 = pcVar18;
      this->n1 = sVar15;
      pcVar10 = pcVar18;
      if ((this->buf[0] == '\b') && (this->bs != 0)) {
        lVar19 = -1;
        lVar20 = 0;
        do {
          lVar11 = lVar20;
          this->n1 = sVar15 + lVar19;
          if (sVar15 - 1 == lVar11) {
            this->nbs = this->nbs + sVar15;
            goto LAB_0010d6c9;
          }
          this->b1 = this->buf + lVar11 + 1;
          lVar19 = lVar19 + -1;
          lVar20 = lVar11 + 1;
        } while (this->buf[lVar11 + 1] == '\b');
        this->nbs = this->nbs + lVar11 + 1;
        this->bs = 0;
        pcVar10 = this->buf + lVar11 + 1;
      }
      std::__cxx11::string::append((char *)&this->solve_msg_,(ulong)pcVar10);
      uVar5 = *__ptr_00;
      goto LAB_0010d6c9;
    }
    sVar7 = fread(__ptr_00,4,1,__stream);
    if (sVar7 == 0) goto LAB_0010e527;
    if (this->L != this->L1) goto LAB_0010d608;
  } while (this->L != 0);
  this->L1 = (this->hdr_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons << 3;
  sVar7 = fread(__ptr_00,4,1,__stream);
  if (sVar7 != 0) {
    uVar5 = this->L - 0x27;
    this->L2 = uVar5;
    if ((uVar5 & 3) != 0 || 0x18 < uVar5) {
      if (this->L == this->L1) goto LAB_0010dc95;
      goto LAB_0010d608;
    }
    sVar7 = fread(pcVar18,7,1,__stream);
    if (sVar7 != 0) {
      if (*(int *)(this->buf + 3) != 0x736e6f69 || *(int *)pcVar18 != 0x6974704f) goto LAB_0010d608;
      sVar7 = fread(this->Options,4,4,__stream);
      if (sVar7 != 0) {
        iVar13 = this->Options[0];
        this->nOpts = iVar13;
        if (iVar13 - 10U < 0xfffffff9) goto LAB_0010dc48;
        if (this->Options[2] == 3) {
          iVar13 = iVar13 + -2;
          this->nOpts = iVar13;
          this->need_vbtol = 1;
        }
        sVar7 = fread(this->Options + 4,4,(ulong)(iVar13 + 1),__stream);
        if ((sVar7 != 0) &&
           ((this->need_vbtol == 0 || (sVar7 = fread(&this->vbtol,8,1,__stream), sVar7 != 0)))) {
          sVar7 = fread(&this->L2,4,1,__stream);
          if ((sVar7 != 0) && (*__ptr_00 == this->L2)) {
            this->have_options = 1;
            goto LAB_0010dc95;
          }
          goto LAB_0010d608;
        }
      }
    }
  }
LAB_0010e527:
  NVar4 = ReportEarlyEof(this);
  goto LAB_0010db47;
LAB_0010db60:
  do {
    do {
      iVar13 = getc(__stream);
      __ptr_00 = local_38;
      this->j = iVar13;
    } while (iVar13 == 10);
  } while (iVar13 == 0xd);
  if (iVar13 == 0x4f) {
    pcVar10 = fgets(pcVar18,0x200,__stream);
    if (pcVar10 == (char *)0x0) goto LAB_0010e527;
    if (*(short *)(this->buf + 4) != 0x736e || *(int *)pcVar18 != 0x6f697470) goto LAB_0010dc95;
    this->have_options = 1;
    this->j = 0;
    do {
      pcVar10 = fgets(pcVar18,0x200,__stream);
      if (pcVar10 == (char *)0x0) goto LAB_0010e527;
      lVar20 = strtol(pcVar18,__endptr,10);
      this->Options[this->j] = (Long)lVar20;
      if (this->se == pcVar18) {
        local_78._0_8_ = local_78 + 0x10;
        sVar7 = strlen(pcVar18);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_78,pcVar18,pcVar18 + sVar7);
        serror(this,"Bad line in \'%s\': %s",this->stub_,local_78._0_8_);
        goto LAB_0010e3d8;
      }
      iVar13 = this->j;
      this->j = iVar13 + 1;
    } while (iVar13 < 3);
    iVar13 = this->Options[0];
    this->nOpts = iVar13;
    if (iVar13 - 10U < 0xfffffff9) {
LAB_0010dc48:
      serror(this,"expected nOpts between 3 and 9; got %d: ");
      goto LAB_0010d608;
    }
    if (this->Options[2] == 3) {
      iVar13 = iVar13 + -2;
      this->nOpts = iVar13;
      this->need_vbtol = 1;
    }
    this->je = iVar13 + 5;
    this->j = 4;
    do {
      pcVar10 = fgets(pcVar18,0x200,__stream);
      if (pcVar10 == (char *)0x0) goto LAB_0010e527;
      lVar20 = strtol(pcVar18,__endptr,10);
      this->Options[this->j] = (Long)lVar20;
      if (this->se == pcVar18) {
        local_78._0_8_ = local_78 + 0x10;
        sVar7 = strlen(pcVar18);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_78,pcVar18,pcVar18 + sVar7);
        serror(this,"Bad line in \'%s\': %s",this->stub_,local_78._0_8_);
        goto LAB_0010e3d8;
      }
      iVar13 = this->j + 1;
      this->j = iVar13;
    } while (iVar13 < this->je);
    if (this->need_vbtol == 0) goto LAB_0010dc95;
    pcVar10 = fgets(pcVar18,0x200,__stream);
    if (pcVar10 == (char *)0x0) goto LAB_0010e527;
    dVar21 = strtod(pcVar18,__endptr);
    this->vbtol = dVar21;
    if (this->se != pcVar18) goto LAB_0010dc95;
    local_78._0_8_ = local_78 + 0x10;
    sVar7 = strlen(pcVar18);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,pcVar18,pcVar18 + sVar7);
    serror(this,"Bad line in \'%s\': %s",this->stub_,local_78._0_8_);
LAB_0010e3d8:
    this->readresult_ = NLW2_SOLRead_Bad_Line;
    if ((FILE *)local_78._0_8_ != (FILE *)(local_78 + 0x10)) goto LAB_0010e3ec;
  }
  else {
    ungetc(iVar13,__stream);
LAB_0010dc95:
    if (this->nbs != 0) {
      pcVar18 = (this->solve_msg_)._M_dataplus._M_p;
      sVar1 = (this->solve_msg_)._M_string_length;
      pcVar10 = pcVar18;
      sVar17 = sVar1;
      if (sVar1 == 0) {
LAB_0010dcca:
        if (pcVar18 + sVar1 != pcVar10) {
          std::__cxx11::string::_M_erase((ulong)&this->solve_msg_,0);
          goto LAB_0010dcf3;
        }
      }
      else {
        do {
          if (*pcVar10 != '\b') goto LAB_0010dcca;
          sVar17 = sVar17 - 1;
          pcVar10 = pcVar10 + 1;
        } while (sVar17 != 0);
      }
      (this->solve_msg_)._M_string_length = 0;
      *pcVar18 = '\0';
    }
LAB_0010dcf3:
    if ((this->solve_msg_)._M_string_length != 0) {
      if (this->binary != 0) {
        std::__cxx11::string::append((char *)&this->solve_msg_);
      }
      pcVar18 = (this->solve_msg_)._M_dataplus._M_p;
      pNVar2 = this->solh_->sol_;
      pNVar2->nbs_ = (int)this->nbs;
      pcVar10 = (char *)(pNVar2->solve_message_)._M_string_length;
      strlen(pcVar18);
      std::__cxx11::string::_M_replace((ulong)&pNVar2->solve_message_,0,pcVar10,(ulong)pcVar18);
    }
    if (this->have_options == 0) {
      iVar13 = (this->hdr_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons;
      this->j = iVar13;
    }
    else {
      this->z = this->Options + (long)this->nOpts + 1;
      this->internal_rv_ = 0x3e4;
      local_78._0_8_ = (FILE *)0x0;
      local_78._8_8_ = 0;
      local_78._16_8_ = 0;
      std::vector<long,std::allocator<long>>::_M_assign_aux<int*>
                ((vector<long,std::allocator<long>> *)local_78,this->Options,
                 this->Options + (long)this->nOpts + 5);
      local_60._M_p._0_1_ = this->need_vbtol != 0;
      local_58 = this->vbtol;
      iVar13 = this->z[3];
      this->j = iVar13;
      this->internal_rv_ = 0x3e5;
      if (iVar13 < 0 || (this->hdr_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars < iVar13) {
        pcVar18 = "Wrong NumVars %d, expected 0..%d: ";
LAB_0010de44:
        serror(this,pcVar18);
LAB_0010de4e:
        NVar4 = ReportBadFormat(this);
LAB_0010de56:
        bVar3 = false;
      }
      else {
        iVar13 = this->z[1];
        this->j = iVar13;
        if (iVar13 < 0 ||
            (this->hdr_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons < iVar13) {
          pcVar18 = "Wrong NumAlgCons %d, expected 0..%d: ";
          goto LAB_0010de44;
        }
        NVar4 = NLW2_SOLRead_Bad_Options;
        bVar3 = true;
        if (this->binary != 0) {
          this->L1 = iVar13 << 3;
          sVar7 = fread(__ptr_00,4,1,__stream);
          if (sVar7 != 0) {
            if (this->L == this->L1) goto LAB_0010de5b;
            goto LAB_0010de4e;
          }
          NVar4 = ReportEarlyEof(this);
          goto LAB_0010de56;
        }
      }
LAB_0010de5b:
      if ((FILE *)local_78._0_8_ != (FILE *)0x0) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
      }
      if (!bVar3) goto LAB_0010db47;
      iVar13 = this->j;
    }
    iVar6 = this->binary;
    if (iVar13 != 0) {
      local_78._12_4_ = iVar13;
      local_78._8_4_ = iVar6;
      local_78._16_8_ = local_78._16_8_ & 0xffffffff00000000;
      local_58 = 0.0;
      local_50._M_local_buf[0] = '\0';
      local_78._0_8_ = __stream;
      local_60._M_p = (pointer)&local_50;
      local_38 = __ptr_00;
      SOLHandler_Easy::OnDualSolution<mp::VecReader<double>>
                (this->solh_,(VecReader<double> *)local_78);
      bVar3 = CheckReader<mp::VecReader<double>>
                        (this,(VecReader<double> *)local_78,&this->readresult_);
      NVar4 = this->readresult_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_p != &local_50) {
        operator_delete(local_60._M_p,
                        CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]) + 1)
        ;
      }
      if (!bVar3) goto LAB_0010db47;
      iVar6 = this->binary;
      __ptr_00 = local_38;
    }
    pNVar16 = &this->hdr_;
    if (this->have_options != 0) {
      pNVar16 = (NLHeader *)(this->z + 3);
    }
    uVar5 = (pNVar16->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
    this->nsv = uVar5;
    this->i = uVar5;
    this->sstatus_seen = 0;
    if (iVar6 != 0) {
      sVar7 = fread(__ptr_00,4,1,__stream);
      if ((sVar7 != 0) && (this->L == this->L1)) {
        this->L1 = this->i << 3;
        sVar7 = fread(__ptr_00,4,1,__stream);
        if ((sVar7 != 0) && (__ptr = &this->L1, *__ptr_00 == *__ptr)) {
          if (this->i != 0) {
            local_78._12_4_ = this->i;
            local_78._8_4_ = this->binary;
            local_78._16_8_ = local_78._16_8_ & 0xffffffff00000000;
            local_58 = 0.0;
            local_50._M_local_buf[0] = '\0';
            local_78._0_8_ = __stream;
            local_60._M_p = (pointer)&local_50;
            local_38 = __ptr_00;
            SOLHandler_Easy::OnPrimalSolution<mp::VecReader<double>>
                      (this->solh_,(VecReader<double> *)local_78);
            bVar3 = CheckReader<mp::VecReader<double>>
                              (this,(VecReader<double> *)local_78,&this->readresult_);
            NVar4 = this->readresult_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_p != &local_50) {
              operator_delete(local_60._M_p,
                              CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]
                                      ) + 1);
            }
            __ptr_00 = local_38;
            if (!bVar3) goto LAB_0010db47;
          }
          sVar7 = fread(__ptr_00,4,1,__stream);
          if ((sVar7 != 0) && (*__ptr_00 == *__ptr)) {
            sVar7 = fread(__ptr_00,4,1,__stream);
            if (sVar7 == 0) goto LAB_0010e38a;
            __size = (ulong)*__ptr_00;
            if ((__size == 8) || (*__ptr_00 == 4)) {
              this->ui = __size;
              sVar7 = fread(this->Objno,__size,1,__stream);
              if ((sVar7 == 1) &&
                 ((sVar7 = fread(__ptr,4,1,__stream), sVar7 == 1 &&
                  (uVar5 = *__ptr_00, uVar5 == *__ptr)))) {
                this->objno = this->Objno[0];
                this->solh_->sol_->solve_result_ = this->Objno[1];
                if ((uVar5 == 8) &&
                   (NVar4 = bsufread(this,(FILE *)__stream), NVar4 != NLW2_SOLRead_OK))
                goto LAB_0010e2a3;
                do {
                  sVar7 = fread(__ptr_00,4,1,__stream);
                } while (sVar7 != 0);
                goto LAB_0010e38a;
              }
            }
          }
        }
      }
LAB_0010d608:
      NVar4 = ReportBadFormat(this);
      goto LAB_0010db47;
    }
    if (uVar5 != 0) {
      local_78._8_8_ = (ulong)uVar5 << 0x20;
      local_78._16_8_ = local_78._16_8_ & 0xffffffff00000000;
      local_58 = 0.0;
      local_50._M_local_buf[0] = '\0';
      local_78._0_8_ = __stream;
      local_60._M_p = (pointer)&local_50;
      SOLHandler_Easy::OnPrimalSolution<mp::VecReader<double>>
                (this->solh_,(VecReader<double> *)local_78);
      bVar3 = CheckReader<mp::VecReader<double>>
                        (this,(VecReader<double> *)local_78,&this->readresult_);
      NVar4 = this->readresult_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_p != &local_50) {
        operator_delete(local_60._M_p,
                        CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]) + 1)
        ;
      }
      if (!bVar3) goto LAB_0010db47;
    }
    pcVar18 = this->buf;
    pcVar10 = fgets(pcVar18,0x200,__stream);
    if (pcVar10 == (char *)0x0) {
LAB_0010e38a:
      this->internal_rv_ = 0;
      NVar4 = NLW2_SOLRead_OK;
      goto LAB_0010db47;
    }
    if (*(short *)(this->buf + 4) == 0x206f && *(int *)pcVar18 == 0x6e6a626f) {
      this->s = this->buf + 6;
      dVar21 = strtod(this->buf + 6,&this->se);
      this->x = dVar21;
      pcVar10 = this->se;
      if (this->s < pcVar10) {
        this->objno = (int)dVar21;
        this->s = pcVar10;
        dVar21 = strtod(pcVar10,&this->se);
        this->x = dVar21;
        if (this->s < this->se) {
          this->Objno[1] = (int)dVar21;
          this->solh_->sol_->solve_result_ = (int)dVar21;
          NVar4 = gsufread(this,(FILE *)__stream);
          if (NVar4 != NLW2_SOLRead_OK) {
LAB_0010e2a3:
            if (NVar4 == NLW2_SOLRead_Bad_Suffix) {
              NVar4 = NLW2_SOLRead_Bad_Suffix;
              serror(this,"Bad suffix in \'%s\'\n",this->stub_);
            }
            else {
              NVar4 = this->readresult_;
            }
            goto LAB_0010db47;
          }
        }
        goto LAB_0010e38a;
      }
    }
    local_78._0_8_ = (FILE *)(local_78 + 0x10);
    sVar7 = strlen(pcVar18);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,pcVar18,pcVar18 + sVar7);
    serror(this,"Bad line in \'%s\': %s",this->stub_,local_78._0_8_);
    this->readresult_ = NLW2_SOLRead_Bad_Line;
    if ((FILE *)local_78._0_8_ != (FILE *)(local_78 + 0x10)) {
LAB_0010e3ec:
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
  }
  NVar4 = NLW2_SOLRead_Bad_Line;
LAB_0010db47:
  fclose(__stream);
  return NVar4;
}

Assistant:

NLW2_SOLReadResultCode
SOLReader2<SOLHandler>::ReadSOLFile(
    const std::string& name) {
  File file;
  stub_ = name.c_str();

  file.Open(stub_, "rb");
  internal_rv_ = 997;
  if (!file) {
    serror("can't open '%s'", stub_);
    internal_rv_ = 998;
    return NLW2_SOLRead_Fail_Open;
  }
  FILE* f = file.GetHandle();
  if (fread((char *)&L, sizeof(uiolen), 1, f)
      && L == 6) {
    /* binary files may be written by Fortran unformatted writes */
    binary = 1;
    if (!fread(buf, 6, 1, f)
        || strncmp(buf,"binary",6)
        || !fread((char *)&L, sizeof(uiolen), 1, f)
        || L != 6) {
      return ReportBadFormat();
    }
  }
  else {
    binary = 0;
    rewind(f);
  }
  have_options = need_vbtol = 0;
  bs = 1;	/* omit initial backspaces */
  nbs = 0; /* number of backspaces omitted */
  if (binary) {     /////////////// BINARY FORMAT //////////
    for(;;) {       /////////////// SOLVE MESSAGE //////////
      if (!fread((char *)&L,sizeof(uiolen),1,f))
        return ReportEarlyEof();
      if ((L1 = L)) {
        do {
          n = L < sizeof(buf) ? (int)L : (int)sizeof(buf);
          L -= n;
          if (!fread(buf, n, 1, f))
            return ReportEarlyEof();
          if (!L) {
            while(n > 0) {
              if (buf[--n] != ' ') {
                ++n;
                break;
              }
            }
          }
          b1 = buf;
          n1 = n;
          if (buf[0] == '\b' && bs) {
            while(--n1 > 0
                  && *++b1 == '\b');
            nbs += n - n1;
            if (n1 > 0)
              bs = 0;
            else
              continue;
          }
          solve_msg_.append(b1, n1);
        }
        while(L);
      }
      if (!fread((char *)&L, sizeof(uiolen), 1, f))
        return ReportEarlyEof();
      if (L != L1)
        return ReportBadFormat();
      if (!L)
        break;
    }
		L1 = NumAlgCons() * sizeof(real);
    if (!fread((char *)&L, sizeof(uiolen), 1, f))
      return ReportEarlyEof();
    L2 = L - (8*sizeof(Long) + 7);
    if (L2 <= 4*sizeof(Long) + sizeof(real)
        && !(L2 & (sizeof(Long)-1))) {
      /////////////// check for Options ///////////////
      if (!fread(buf, 7, 1, f))
        return ReportEarlyEof();
      if (strncmp(buf, "Options", 7))
        return ReportBadFormat();
      if (!fread((char *)Options, sizeof(Long), 4, f))
        return ReportEarlyEof();
      nOpts = Options[0];
      if (nOpts < 3 || nOpts > 9) {
bad_nOpts:
        serror(
              "expected nOpts between 3 and 9; got %d: ",
              nOpts);
        return ReportBadFormat();
      }
      if (Options[2] == 3) {
        nOpts -= 2;
        need_vbtol = 1;
      }
      if (!fread((char *)(Options+4), sizeof(Long),
                 (size_t)(nOpts+1), f))
        return ReportEarlyEof();
      if (need_vbtol
          && !fread((char *)&vbtol, sizeof(real), 1, f))
        return ReportEarlyEof();
      if (!fread((char *)&L2, sizeof(uiolen), 1, f)
          || L != L2)
        return ReportBadFormat();
      have_options = 1;
    }
    else if (L != L1)
      return ReportBadFormat();
  }
  else {         ///////////////// TEXT FORMAT ///////////////
    for(;;) {    ///////////////// SOLVE MESSAGE /////////////
      if (!fgets(buf, sizeof(buf), f)) {
        return ReportEarlyEof();
      }
      for(se = buf; *se; se++)
        if (*se == '\r' && se[1] == '\n') {
          *se = '\n';
          *++se = 0;
          break;
        }
      if (*buf == '\n')
        break;
      n1 = se - buf;
      b1 = buf;
      if (buf[0] == '\b' && bs) {
        n = n1;
        while(--n1 > 0 && *++b1 == '\b');
        nbs += n - n1;
        if (n1 > 0)
          bs = 0;
        else
          continue;
      }
      solve_msg_.append(b1, n1);
    }
    while((j = getc(f)) == '\n' || j == '\r');
    if (j != 'O')     ////////// Check for Options //////////
      ungetc(j,f);
    else {
      if (!fgets(buf, sizeof(buf), f))
        return ReportEarlyEof();
      if (!strncmp(buf, "ptions", 6)) {
        have_options = 1;
        for(j = 0; j < 4; j++) {
          if (!fgets(buf, sizeof(buf), f))
            return ReportEarlyEof();
          Options[j] = (int)strtol(buf,&se,10);
          if (se == buf)
            return ReportBadLine(buf);
        }
        nOpts = Options[0];
        if (nOpts < 3 || nOpts > 9)
          goto bad_nOpts;
        if (Options[2] == 3) {
          nOpts -= 2;
          need_vbtol = 1;
        }
        je = (int)(nOpts+5);
        for(j = 4; j < je; j++) {
          if (!fgets(buf, sizeof(buf), f))
            return ReportEarlyEof();
          Options[j] = (int)strtol(buf,&se,10);
          if (se == buf)
            return ReportBadLine(buf);
        }
        if (need_vbtol) {
          if (!fgets(buf, sizeof(buf), f))
            return ReportEarlyEof();
          vbtol = strtod(buf,&se);
          if (se == buf)
            return ReportBadLine(buf);
        }
      }
    }
  }

  /* send termination msg */
  if (nbs) {
    // Should not have \b here but...
    auto b=solve_msg_.begin();
    while (solve_msg_.end()!=b && '\b'==*b)
      ++b;
    solve_msg_.erase(solve_msg_.begin(), b);
  }
  if (solve_msg_.size()) {
    if (binary)
      solve_msg_ += "\n";
    Handler().OnSolveMessage(
          solve_msg_.c_str(), nbs);
  }

  if (have_options) {
    z = Options + nOpts + 1;
    internal_rv_ = 996;
    // Send options to Handler:
    typename SOLHandler::AMPLOptions ao;
    ao.options_.assign(Options, Options+nOpts+5);
    ao.has_vbtol_ = need_vbtol;
    ao.vbtol_ = vbtol;
    // Handler says we should stop:
    if (auto rv = Handler().OnAMPLOptions(ao)) {
      internal_rv_ = rv;
      return NLW2_SOLRead_Bad_Options;
    }

    // Some checks.
    j = (int)z[3];
    internal_rv_ = 997;
		if (j > NumVars() || j < 0) {
      serror("Wrong NumVars %d, expected 0..%d: ",
						 j, NumVars());
      return ReportBadFormat();
      }
    j = (int)z[1];
		if (j > NumAlgCons() || j < 0) {
      serror("Wrong NumAlgCons %d, expected 0..%d: ",
						 j, NumAlgCons());
      return ReportBadFormat();
      }

    if (binary) {      // read on for binary
      L1 = j * sizeof(real);
      if (!fread((char *)&L, sizeof(uiolen), 1, f))
        return ReportEarlyEof();
      if (L != L1)
        return ReportBadFormat();
    }
  }
	else j = NumAlgCons();

  // Read duals
  if (j) {
    VecReader<double> vr(f, binary, j);
    Handler().OnDualSolution(vr);
    if (!CheckReader( vr, readresult_ ))
      return readresult_;
  }

	i = nsv = have_options ? (int)z[3] : NumVars();
//  objno = ac_->no >= 0 ? 0 : -1;
  sstatus_seen = 0;
  if (binary) {
    if (!fread((char *)&L, sizeof(uiolen), 1, f) || L != L1)
      return ReportBadFormat();
    L1 = i * sizeof(real);
    if (!fread((char *)&L, sizeof(uiolen), 1, f) || L != L1)
      return ReportBadFormat();

    // Read primal solution
    if (i) {
      VecReader<double> vr(f, binary, i);
      Handler().OnPrimalSolution(vr);
      if (!CheckReader( vr, readresult_ ))
        return readresult_;
    }

    if (!fread((char *)&L, sizeof(uiolen), 1, f) || L != L1)
      return ReportBadFormat();

    /* do we have an objno ? */
    if (fread((char *)&L, sizeof(uiolen), 1, f)) {
      if (L != 2*sizeof(Long) && L != sizeof(integer))
        return ReportBadFormat();
      ui = (size_t) L;
      if (fread(Objno, ui, 1, f) != 1
       || fread(&L1, sizeof(uiolen), 1, f) != 1
       || L != L1)
        return ReportBadFormat();
      objno = (int)Objno[0];

      /* Submit objno and solve_code to Handler. */
      Handler().OnObjno(objno);
      Handler().OnSolveCode(Objno[1]);

      if (L == 2*sizeof(integer)) {
        switch(bsufread(f)) {
        case NLW2_SOLRead_Bad_Suffix:
badsuftable:
          serror("Bad suffix in '%s'\n", stub_);
          return NLW2_SOLRead_Bad_Suffix;
        case NLW2_SOLRead_OK:
          break;
        default:
          return readresult_;
        }
      }
      while(fread(&L, sizeof(uiolen), 1, f)) {}
    }
  }
  else {
    // Read primal solution
    if (i) {
      VecReader<double> vr(f, binary, i);
      Handler().OnPrimalSolution(vr);
      if (!CheckReader( vr, readresult_ ))
        return readresult_;
    }

    if (!fgets(buf,sizeof(buf), f))
      goto f_done;
    if (strncmp(buf,"objno ",6)) {
bad_objno:
      return ReportBadLine(buf);
      }
    x = strtod(s = buf+6, &se);
    if (se <= s)
      goto bad_objno;
    objno = (int)x;
    x = strtod(s = se, &se);
    if (se <= s)
      goto f_done;
    Objno[1] = (Long)x;

    /* Submit objno and solve_code to Handler. */
    Handler().OnObjno(objno);
    Handler().OnSolveCode(Objno[1]);

    switch(gsufread(f)) {
    case NLW2_SOLRead_Bad_Suffix:
      goto badsuftable;
    case NLW2_SOLRead_OK:
      break;
    default:
      return readresult_;
    }
  }
f_done:
  internal_rv_ = 0;
  return NLW2_SOLRead_OK;
}